

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

bool __thiscall cmMakefile::SetPolicy(cmMakefile *this,PolicyID id,PolicyStatus status)

{
  PolicyStatus PVar1;
  PolicyID id_00;
  string msg;
  
  if (status != NEW) {
    PVar1 = cmPolicies::GetPolicyStatus(id);
    if (PVar1 == REQUIRED_ALWAYS) {
      cmPolicies::GetRequiredAlwaysPolicyError_abi_cxx11_(&msg,(cmPolicies *)(ulong)id,id_00);
      IssueMessage(this,FATAL_ERROR,&msg);
      std::__cxx11::string::~string((string *)&msg);
      return false;
    }
    if ((int)id < 0x25 && status == OLD) {
      cmPolicies::GetPolicyDeprecatedWarning_abi_cxx11_(&msg,(cmPolicies *)(ulong)id,id_00);
      IssueMessage(this,DEPRECATION_WARNING,&msg);
      std::__cxx11::string::~string((string *)&msg);
    }
  }
  cmStateSnapshot::SetPolicy(&this->StateSnapshot,id,status);
  return true;
}

Assistant:

bool cmMakefile::SetPolicy(cmPolicies::PolicyID id,
                           cmPolicies::PolicyStatus status)
{
  // A REQUIRED_ALWAYS policy may be set only to NEW.
  if (status != cmPolicies::NEW &&
      cmPolicies::GetPolicyStatus(id) == cmPolicies::REQUIRED_ALWAYS) {
    std::string msg = cmPolicies::GetRequiredAlwaysPolicyError(id);
    this->IssueMessage(cmake::FATAL_ERROR, msg);
    return false;
  }

  // Deprecate old policies, especially those that require a lot
  // of code to maintain the old behavior.
  if (status == cmPolicies::OLD && id <= cmPolicies::CMP0036) {
    this->IssueMessage(cmake::DEPRECATION_WARNING,
                       cmPolicies::GetPolicyDeprecatedWarning(id));
  }

  this->StateSnapshot.SetPolicy(id, status);
  return true;
}